

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_hash.hpp
# Opt level: O0

void __thiscall
libtorrent::info_hash_t::for_each<libtorrent::aux::torrent::lsd_announce()::__0>
          (info_hash_t *this,anon_class_16_2_3fe4823c f)

{
  bool bVar1;
  char *s;
  digest32<160L> local_34;
  info_hash_t *local_20;
  info_hash_t *this_local;
  anon_class_16_2_3fe4823c f_local;
  
  f_local.this = (torrent *)f.port;
  this_local = (info_hash_t *)f.this;
  local_20 = this;
  bVar1 = has_v1(this);
  if (bVar1) {
    libtorrent::aux::torrent::lsd_announce::anon_class_16_2_3fe4823c::operator()
              ((anon_class_16_2_3fe4823c *)&this_local,&this->v1,V1);
  }
  bVar1 = has_v2(this);
  if (bVar1) {
    s = digest32<256L>::data(&this->v2);
    digest32<160L>::digest32(&local_34,s);
    libtorrent::aux::torrent::lsd_announce::anon_class_16_2_3fe4823c::operator()
              ((anon_class_16_2_3fe4823c *)&this_local,&local_34,V2);
  }
  return;
}

Assistant:

void for_each(F f) const
		{
			if (has_v1()) f(v1, protocol_version::V1);
			if (has_v2()) f(sha1_hash(v2.data()), protocol_version::V2);
		}